

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_function_primitive_applyWithExpandedArguments
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  size_t local_118;
  size_t i;
  sysbvm_stackFrameGCRootsRecord_t callFrameStackRecord;
  sysbvm_functionCallFrameStack_t callFrameStack;
  size_t callArgumentCount;
  sysbvm_tuple_t *argumentList;
  sysbvm_tuple_t *function;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  callFrameStack.gcRoots.applicationArguments[0xf] = sysbvm_array_getSize(arguments[1]);
  memset(&callFrameStackRecord.roots,0,0xb0);
  memset(&i,0,0x20);
  callFrameStackRecord.previous._0_4_ = 0;
  callFrameStackRecord.type = 0x11;
  callFrameStackRecord._12_4_ = 0;
  callFrameStackRecord.rootCount = (size_t)&callFrameStack.argumentIndex;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&i);
  sysbvm_functionCallFrameStack_begin
            (context,(sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots,*arguments,
             callFrameStack.gcRoots.applicationArguments[0xf],2);
  for (local_118 = 0; local_118 < callFrameStack.gcRoots.applicationArguments[0xf];
      local_118 = local_118 + 1) {
    sVar1 = sysbvm_array_at(arguments[1],local_118);
    sysbvm_functionCallFrameStack_push
              ((sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots,sVar1);
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&i);
  sVar1 = sysbvm_functionCallFrameStack_finish
                    (context,(sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_function_primitive_applyWithExpandedArguments(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *function = &arguments[0];
    sysbvm_tuple_t *argumentList = &arguments[1];

    size_t callArgumentCount = sysbvm_array_getSize(*argumentList);

    sysbvm_functionCallFrameStack_t callFrameStack = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(callFrameStackRecord, callFrameStack.gcRoots);

    sysbvm_functionCallFrameStack_begin(context, &callFrameStack, *function, callArgumentCount, SYSBVM_FUNCTION_APPLICATION_FLAGS_VARIADIC_EXPANDED);
    for(size_t i = 0; i < callArgumentCount; ++i)
        sysbvm_functionCallFrameStack_push(&callFrameStack, sysbvm_array_at(*argumentList, i));

    SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
    return sysbvm_functionCallFrameStack_finish(context, &callFrameStack);
}